

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

decimal_fp<double> fmt::v11::detail::dragonbox::to_decimal<double>(double x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  char cVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  uint uVar27;
  uint128_fallback uVar28;
  decimal_fp<double> dVar29;
  
  uVar26 = (ulong)x & 0xfffffffffffff;
  uVar27 = (uint)((ulong)x >> 0x34) & 0x7ff;
  if (uVar27 == 0) {
    uVar27 = 0xfffffbce;
    if (uVar26 == 0) {
      iVar20 = 0;
      uVar26 = 0;
      goto LAB_001202a1;
    }
LAB_0011ff91:
    iVar20 = (int)(uVar27 * 0x4d105) >> 0x14;
    uVar28 = cache_accessor<double>::get_cached_power(2 - iVar20);
    uVar17 = uVar28.hi_;
    uVar13 = uVar28.lo_;
    iVar23 = ((2 - iVar20) * 0x1a934f >> 0x13) + uVar27;
    bVar14 = (byte)iVar23;
    uVar19 = uVar26 * 2;
    uVar22 = uVar26 * 2 + 1 << (bVar14 & 0x3f);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar22;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar17;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar22;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar13;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = SUB168(auVar2 * auVar9,8);
    auVar12 = auVar1 * auVar8 + auVar12;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = auVar12._8_8_;
    uVar22 = SUB168(auVar3 * ZEXT816(0x20c49ba5e353f7cf),8) >> 7;
    uVar27 = auVar12._8_4_ + (int)uVar22 * -1000;
    uVar24 = (uint)(uVar17 >> (~bVar14 & 0x3f));
    if (uVar27 < uVar24) {
      if ((uVar27 != 0) || ((auVar12._0_8_ != 0 || ((uVar26 & 1) == 0)))) {
LAB_0012007a:
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar22;
        iVar20 = iVar20 + 1;
        if (SUB168(auVar5 * ZEXT816(0xabcc77118461cefd),0) < 0xabcc77118461cefd &&
            (auVar5 * ZEXT816(0xabcc77118461cefd) & (undefined1  [16])0x3ffffff) ==
            (undefined1  [16])0x0) {
          uVar26 = uVar22 / 100000000;
          uVar27 = 8;
          do {
            uVar24 = uVar27;
            uVar15 = (int)uVar26 * 0x40000000 | (uint)((int)uVar26 * -0x3d70a3d7) >> 2;
            uVar19 = (ulong)uVar15;
            if (0x28f5c28 < uVar15) {
              uVar19 = uVar26;
            }
            uVar16 = (uint)uVar19;
            uVar26 = uVar19;
            uVar27 = uVar24 + 2;
          } while (0x28f5c28 >= uVar15);
          goto LAB_00120287;
        }
        uVar27 = 0;
        do {
          uVar24 = uVar27;
          uVar19 = uVar22;
          uVar22 = uVar19 * -0x70a3d70a3d70a3d7 >> 2 | uVar19 << 0x3e;
          uVar27 = uVar24 + 2;
        } while (uVar22 < 0x28f5c28f5c28f5d);
        uVar22 = uVar19 * -0x3333333333333333 >> 1 | uVar19 << 0x3f;
        uVar26 = uVar22;
        if (uVar22 >= 0x199999999999999a) {
          uVar26 = uVar19;
        }
        uVar24 = uVar24 | uVar22 < 0x199999999999999a;
        goto LAB_0012029f;
      }
      uVar22 = uVar22 - 1;
      uVar27 = 1000;
    }
    else if ((uVar27 <= uVar24) &&
            (auVar4._8_8_ = 0, auVar4._0_8_ = uVar13, auVar10._8_8_ = 0, auVar10._0_8_ = uVar19 - 1,
            uVar18 = SUB168(auVar4 * auVar10,8) + uVar17 * (uVar19 - 1),
            ((uint)(uVar18 << (bVar14 & 0x3f) == 0 &&
                   SUB168(auVar4 * auVar10,0) >> 0x40 - (bVar14 & 0x3f) == 0) & ~(uint)uVar26) != 0
            || (uVar18 >> ((ulong)(byte)(0x40 - bVar14) & 0x3f) & 1) != 0)) goto LAB_0012007a;
    iVar25 = uVar27 - (uVar24 >> 1);
    uVar27 = iVar25 * 0x290 + 0x8020;
    uVar26 = (ulong)(uVar27 >> 0x10) + uVar22 * 10;
    if ((uVar27 & 0xffff) < 0x290) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar13;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar19;
      uVar19 = SUB168(auVar6 * auVar11,8) + uVar17 * uVar19;
      uVar24 = 0x40 - iVar23;
      if (((uVar19 >> ((ulong)uVar24 & 0x3f) & 1) != 0) == (bool)((byte)iVar25 & 1)) {
        uVar26 = uVar26 - ((byte)(uVar27 >> 0x10) & 1 &
                          (SUB168(auVar6 * auVar11,0) >> ((byte)uVar24 & 0x3f) == 0 &&
                          uVar19 << (bVar14 & 0x3f) == 0));
      }
      else {
        uVar26 = uVar26 - 1;
      }
    }
  }
  else {
    uVar27 = uVar27 - 0x433;
    if (uVar26 != 0) {
      uVar26 = uVar26 + 0x10000000000000;
      goto LAB_0011ff91;
    }
    iVar20 = (int)(uVar27 * 0x9a209 + -0x3fe1f) >> 0x15;
    cVar21 = (char)(iVar20 * -0x1a934f >> 0x13) + (char)uVar27;
    uVar28 = cache_accessor<double>::get_cached_power(-iVar20);
    uVar19 = uVar28.hi_;
    bVar14 = 0xb - cVar21;
    uVar22 = (ulong)((uVar27 & 0xfffffffe) != 2) + (uVar19 - (uVar19 >> 0x36) >> (bVar14 & 0x3f));
    uVar26 = ((uVar19 >> 0x35) + uVar19 >> (bVar14 & 0x3f)) / 10;
    if (uVar26 * 10 < uVar22) {
      uVar26 = (uVar19 >> (10U - cVar21 & 0x3f)) + 1 >> 1;
      if (uVar27 == 0xffffffb3) {
        uVar26 = uVar26 & 0xfffffffffffffffe;
      }
      else {
        uVar26 = uVar26 + (uVar26 < uVar22);
      }
      goto LAB_001202a1;
    }
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar26;
    iVar20 = iVar20 + 1;
    if (SUB168(auVar7 * ZEXT816(0xabcc77118461cefd),0) < 0xabcc77118461cefd &&
        (auVar7 * ZEXT816(0xabcc77118461cefd) & (undefined1  [16])0x3ffffff) ==
        (undefined1  [16])0x0) {
      uVar26 = uVar26 / 100000000;
      uVar27 = 8;
      do {
        uVar24 = uVar27;
        uVar19 = uVar26 & 0xffffffff;
        uVar15 = (int)uVar26 * 0x40000000 | (uint)((int)uVar26 * -0x3d70a3d7) >> 2;
        uVar26 = (ulong)uVar15;
        if (0x28f5c28 < uVar15) {
          uVar26 = uVar19;
        }
        uVar16 = (uint)uVar26;
        uVar27 = uVar24 + 2;
      } while (0x28f5c28 >= uVar15);
LAB_00120287:
      uVar15 = uVar16 * -0x33333333 >> 1 | (uint)((uVar16 * -0x33333333 & 1) != 0) << 0x1f;
      uVar27 = uVar15;
      if (uVar15 >= 0x1999999a) {
        uVar27 = uVar16;
      }
      uVar26 = (ulong)uVar27;
      uVar24 = uVar24 | uVar15 < 0x1999999a;
    }
    else {
      uVar27 = 0;
      do {
        uVar24 = uVar27;
        uVar19 = uVar26;
        uVar26 = uVar19 * -0x70a3d70a3d70a3d7 >> 2 | uVar19 << 0x3e;
        uVar27 = uVar24 + 2;
      } while (uVar26 < 0x28f5c28f5c28f5d);
      uVar22 = uVar19 * -0x3333333333333333 >> 1 | uVar19 << 0x3f;
      uVar26 = uVar22;
      if (uVar22 >= 0x199999999999999a) {
        uVar26 = uVar19;
      }
      uVar24 = uVar24 | uVar22 < 0x199999999999999a;
    }
LAB_0012029f:
    iVar20 = iVar20 + uVar24;
  }
LAB_001202a1:
  dVar29.exponent = iVar20;
  dVar29.significand = uVar26;
  dVar29._12_4_ = 0;
  return dVar29;
}

Assistant:

auto to_decimal(T x) noexcept -> decimal_fp<T> {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << num_significand_bits<T>()) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent =
      static_cast<int>((br & exponent_mask<T>()) >> num_significand_bits<T>());

  if (exponent != 0) {  // Check if normal.
    exponent -= exponent_bias<T>() + num_significand_bits<T>();

    // Shorter interval case; proceed like Schubfach.
    // In fact, when exponent == 1 and significand == 0, the interval is
    // regular. However, it can be shown that the end-results are anyway same.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |= (static_cast<carrier_uint>(1) << num_significand_bits<T>());
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent =
        std::numeric_limits<T>::min_exponent - num_significand_bits<T>() - 1;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai.
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta);
  const carrier_uint two_fc = significand << 1;

  // For the case of binary32, the result of integer check is not correct for
  // 29711844 * 2^-82
  // = 6.1442653300000000008655037797566933477355632930994033813476... * 10^-18
  // and 29711844 * 2^-81
  // = 1.2288530660000000001731007559513386695471126586198806762695... * 10^-17,
  // and they are the unique counterexamples. However, since 29711844 is even,
  // this does not cause any problem for the endpoints calculations; it can only
  // cause a problem when we need to perform integer check for the center.
  // Fortunately, with these inputs, that branch is never executed, so we are
  // fine.
  const typename cache_accessor<T>::compute_mul_result z_mul =
      cache_accessor<T>::compute_mul((two_fc | 1) << beta, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary.

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here.
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(z_mul.result);
  uint32_t r = static_cast<uint32_t>(z_mul.result - float_info<T>::big_divisor *
                                                        ret_value.significand);

  if (r < deltai) {
    // Exclude the right endpoint if necessary.
    if (r == 0 && (z_mul.is_integer & !include_right_endpoint)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else if (r > deltai) {
    goto small_divisor_case_label;
  } else {
    // r == deltai; compare fractional parts.
    const typename cache_accessor<T>::compute_mul_parity_result x_mul =
        cache_accessor<T>::compute_mul_parity(two_fc - 1, cache, beta);

    if (!(x_mul.parity | (x_mul.is_integer & include_left_endpoint)))
      goto small_divisor_case_label;
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros.
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor.

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  uint32_t dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);
  const bool approx_y_parity =
      ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;

  // Is dist divisible by 10^kappa?
  const bool divisible_by_small_divisor =
      check_divisibility_and_divide_by_pow10<float_info<T>::kappa>(dist);

  // Add dist / 10^kappa to the significand.
  ret_value.significand += dist;

  if (!divisible_by_small_divisor) return ret_value;

  // Check z^(f) >= epsilon^(f).
  // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
  // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f).
  // Since there are only 2 possibilities, we only need to care about the
  // parity. Also, zi and r should have the same parity since the divisor
  // is an even number.
  const auto y_mul = cache_accessor<T>::compute_mul_parity(two_fc, cache, beta);

  // If z^(f) >= epsilon^(f), we might have a tie when z^(f) == epsilon^(f),
  // or equivalently, when y is an integer.
  if (y_mul.parity != approx_y_parity)
    --ret_value.significand;
  else if (y_mul.is_integer & (ret_value.significand % 2 != 0))
    --ret_value.significand;
  return ret_value;
}